

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceArrayIntersectorKMB<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  NodeRef *pNVar11;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  uint uVar16;
  size_t sVar17;
  Primitive_conflict4 *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar18;
  bool bVar19;
  byte bVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar38;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar39;
  undefined1 in_ZMM0 [64];
  undefined1 auVar40 [64];
  vfloat_impl<4> __tmp;
  undefined1 auVar41 [16];
  vint4 ai_2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar42;
  vint4 ai;
  undefined1 auVar43 [16];
  vint4 ai_1;
  undefined1 auVar44 [16];
  vint4 ai_3;
  undefined1 auVar45 [16];
  vint4 bi;
  undefined1 auVar46 [16];
  vint4 bi_1;
  undefined1 auVar47 [16];
  vint4 bi_3;
  undefined1 auVar48 [16];
  vint4 bi_2;
  undefined1 auVar49 [64];
  vint4 bi_10;
  undefined1 auVar50 [64];
  vbool<4>_conflict valid_leaf;
  Precalculations pre;
  size_t asStack_34e8 [2];
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar27 [16];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    auVar27 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    uVar21 = vpcmpeqd_avx512vl(auVar27,(undefined1  [16])valid_i->field_0);
    uVar21 = uVar21 & 0xf;
    bVar20 = (byte)uVar21;
    if (bVar20 != 0) {
      auVar27 = *(undefined1 (*) [16])(ray + 0x40);
      auVar23 = *(undefined1 (*) [16])(ray + 0x50);
      auVar3 = *(undefined1 (*) [16])(ray + 0x60);
      auVar25._8_4_ = 0x7fffffff;
      auVar25._0_8_ = 0x7fffffff7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx(auVar27,auVar25);
      auVar30._8_4_ = 0x219392ef;
      auVar30._0_8_ = 0x219392ef219392ef;
      auVar30._12_4_ = 0x219392ef;
      uVar10 = vcmpps_avx512vl(auVar22,auVar30,1);
      bVar19 = (bool)((byte)uVar10 & 1);
      auVar22._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar27._0_4_;
      bVar19 = (bool)((byte)(uVar10 >> 1) & 1);
      auVar22._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar27._4_4_;
      bVar19 = (bool)((byte)(uVar10 >> 2) & 1);
      auVar22._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar27._8_4_;
      bVar19 = (bool)((byte)(uVar10 >> 3) & 1);
      auVar22._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar27._12_4_;
      auVar27 = vandps_avx(auVar23,auVar25);
      uVar10 = vcmpps_avx512vl(auVar27,auVar30,1);
      bVar19 = (bool)((byte)uVar10 & 1);
      auVar26._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar23._0_4_;
      bVar19 = (bool)((byte)(uVar10 >> 1) & 1);
      auVar26._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar23._4_4_;
      bVar19 = (bool)((byte)(uVar10 >> 2) & 1);
      auVar26._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar23._8_4_;
      bVar19 = (bool)((byte)(uVar10 >> 3) & 1);
      auVar26._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar23._12_4_;
      auVar27 = vandps_avx(auVar3,auVar25);
      uVar10 = vcmpps_avx512vl(auVar27,auVar30,1);
      bVar19 = (bool)((byte)uVar10 & 1);
      auVar23._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar3._0_4_;
      bVar19 = (bool)((byte)(uVar10 >> 1) & 1);
      auVar23._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar3._4_4_;
      bVar19 = (bool)((byte)(uVar10 >> 2) & 1);
      auVar23._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar3._8_4_;
      bVar19 = (bool)((byte)(uVar10 >> 3) & 1);
      auVar23._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar3._12_4_;
      auVar24 = vrcp14ps_avx512vl(auVar22);
      auVar31._8_4_ = 0x3f800000;
      auVar31._0_8_ = 0x3f8000003f800000;
      auVar31._12_4_ = 0x3f800000;
      auVar27 = vfnmadd213ps_fma(auVar22,auVar24,auVar31);
      auVar25 = vrcp14ps_avx512vl(auVar26);
      auVar3 = vfnmadd213ps_fma(auVar26,auVar25,auVar31);
      auVar26 = vrcp14ps_avx512vl(auVar23);
      auVar22 = vfnmadd213ps_fma(auVar23,auVar26,auVar31);
      auVar23 = vfmadd132ps_fma(auVar27,auVar24,auVar24);
      auVar3 = vfmadd132ps_fma(auVar3,auVar25,auVar25);
      auVar22 = vfmadd132ps_fma(auVar22,auVar26,auVar26);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar49 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar27 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x20);
      aVar28._0_4_ = (uint)(bVar20 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar20 & 1) * 0x7f800000;
      bVar19 = (bool)((byte)(uVar21 >> 1) & 1);
      aVar28._4_4_ = (uint)bVar19 * auVar27._4_4_ | (uint)!bVar19 * 0x7f800000;
      bVar19 = (bool)((byte)(uVar21 >> 2) & 1);
      aVar28._8_4_ = (uint)bVar19 * auVar27._8_4_ | (uint)!bVar19 * 0x7f800000;
      bVar19 = SUB81(uVar21 >> 3,0);
      aVar28._12_4_ = (uint)bVar19 * auVar27._12_4_ | (uint)!bVar19 * 0x7f800000;
      auVar27 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x20);
      bVar19 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar5 = SUB81(uVar21 >> 3,0);
      auVar50 = ZEXT1664(CONCAT412((uint)bVar5 * auVar27._12_4_ | (uint)!bVar5 * -0x800000,
                                   CONCAT48((uint)bVar4 * auVar27._8_4_ | (uint)!bVar4 * -0x800000,
                                            CONCAT44((uint)bVar19 * auVar27._4_4_ |
                                                     (uint)!bVar19 * -0x800000,
                                                     (uint)(bVar20 & 1) * auVar27._0_4_ |
                                                     (uint)!(bool)(bVar20 & 1) * -0x800000))));
      pNVar11 = stack_node + 2;
      auVar27 = *(undefined1 (*) [16])ray;
      auVar41._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      auVar41._8_4_ = auVar27._8_4_ ^ 0x80000000;
      auVar41._12_4_ = auVar27._12_4_ ^ 0x80000000;
      paVar18 = &stack_near[2].field_0;
      auVar26 = vmulps_avx512vl(auVar23,auVar41);
      auVar27 = *(undefined1 (*) [16])(ray + 0x10);
      auVar29._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      auVar29._8_4_ = auVar27._8_4_ ^ 0x80000000;
      auVar29._12_4_ = auVar27._12_4_ ^ 0x80000000;
      auVar27 = *(undefined1 (*) [16])(ray + 0x20);
      auVar24._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      auVar24._8_4_ = auVar27._8_4_ ^ 0x80000000;
      auVar24._12_4_ = auVar27._12_4_ ^ 0x80000000;
      auVar27 = vmulps_avx512vl(auVar3,auVar29);
      auVar24 = vmulps_avx512vl(auVar22,auVar24);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[1].field_0 = aVar28;
LAB_01d86e25:
      sVar17 = pNVar11[-1].ptr;
      if (sVar17 != 0xfffffffffffffff8) {
        pNVar11 = pNVar11 + -1;
        paVar1 = paVar18 + -1;
        auVar40 = ZEXT1664((undefined1  [16])*paVar1);
        paVar18 = paVar18 + -1;
        auVar25 = auVar50._0_16_;
        uVar6 = vcmpps_avx512vl((undefined1  [16])*paVar1,auVar25,1);
        if ((char)uVar6 != '\0') {
          while( true ) {
            uVar6 = vcmpps_avx512vl(auVar25,auVar40._0_16_,6);
            valid_leaf.v = (__mmask8)uVar6;
            uVar16 = (uint)sVar17;
            if ((sVar17 & 8) != 0) break;
            uVar10 = sVar17 & 0xfffffffffffffff0;
            auVar40 = ZEXT1664(auVar49._0_16_);
            uVar21 = 0;
            sVar17 = 8;
            for (lVar12 = -0x20;
                (lVar12 != 0 && (sVar14 = *(size_t *)(uVar10 + 0x40 + lVar12 * 2), sVar14 != 8));
                lVar12 = lVar12 + 4) {
              uVar2 = *(undefined4 *)(uVar10 + 0x120 + lVar12);
              auVar43._4_4_ = uVar2;
              auVar43._0_4_ = uVar2;
              auVar43._8_4_ = uVar2;
              auVar43._12_4_ = uVar2;
              auVar41 = *(undefined1 (*) [16])(ray + 0x70);
              uVar2 = *(undefined4 *)(uVar10 + 0x60 + lVar12);
              auVar32._4_4_ = uVar2;
              auVar32._0_4_ = uVar2;
              auVar32._8_4_ = uVar2;
              auVar32._12_4_ = uVar2;
              auVar29 = vfmadd213ps_avx512vl(auVar43,auVar41,auVar32);
              uVar2 = *(undefined4 *)(uVar10 + 0x160 + lVar12);
              auVar44._4_4_ = uVar2;
              auVar44._0_4_ = uVar2;
              auVar44._8_4_ = uVar2;
              auVar44._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar10 + 0xa0 + lVar12);
              auVar33._4_4_ = uVar2;
              auVar33._0_4_ = uVar2;
              auVar33._8_4_ = uVar2;
              auVar33._12_4_ = uVar2;
              auVar30 = vfmadd213ps_avx512vl(auVar44,auVar41,auVar33);
              uVar2 = *(undefined4 *)(uVar10 + 0x1a0 + lVar12);
              auVar45._4_4_ = uVar2;
              auVar45._0_4_ = uVar2;
              auVar45._8_4_ = uVar2;
              auVar45._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar10 + 0xe0 + lVar12);
              auVar34._4_4_ = uVar2;
              auVar34._0_4_ = uVar2;
              auVar34._8_4_ = uVar2;
              auVar34._12_4_ = uVar2;
              auVar31 = vfmadd213ps_avx512vl(auVar45,auVar41,auVar34);
              uVar2 = *(undefined4 *)(uVar10 + 0x140 + lVar12);
              auVar46._4_4_ = uVar2;
              auVar46._0_4_ = uVar2;
              auVar46._8_4_ = uVar2;
              auVar46._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar10 + 0x80 + lVar12);
              auVar35._4_4_ = uVar2;
              auVar35._0_4_ = uVar2;
              auVar35._8_4_ = uVar2;
              auVar35._12_4_ = uVar2;
              auVar32 = vfmadd213ps_avx512vl(auVar46,auVar41,auVar35);
              uVar2 = *(undefined4 *)(uVar10 + 0x180 + lVar12);
              auVar47._4_4_ = uVar2;
              auVar47._0_4_ = uVar2;
              auVar47._8_4_ = uVar2;
              auVar47._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar10 + 0xc0 + lVar12);
              auVar36._4_4_ = uVar2;
              auVar36._0_4_ = uVar2;
              auVar36._8_4_ = uVar2;
              auVar36._12_4_ = uVar2;
              auVar33 = vfmadd213ps_avx512vl(auVar47,auVar41,auVar36);
              uVar2 = *(undefined4 *)(uVar10 + 0x1c0 + lVar12);
              auVar48._4_4_ = uVar2;
              auVar48._0_4_ = uVar2;
              auVar48._8_4_ = uVar2;
              auVar48._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar10 + 0x100 + lVar12);
              auVar37._4_4_ = uVar2;
              auVar37._0_4_ = uVar2;
              auVar37._8_4_ = uVar2;
              auVar37._12_4_ = uVar2;
              auVar34 = vfmadd213ps_avx512vl(auVar48,auVar41,auVar37);
              auVar35 = vfmadd213ps_avx512vl(auVar29,auVar23,auVar26);
              auVar36 = vfmadd213ps_avx512vl(auVar30,auVar3,auVar27);
              auVar37 = vfmadd213ps_avx512vl(auVar31,auVar22,auVar24);
              auVar31 = vfmadd213ps_avx512vl(auVar32,auVar23,auVar26);
              auVar32 = vfmadd213ps_avx512vl(auVar33,auVar3,auVar27);
              auVar33 = vfmadd213ps_avx512vl(auVar34,auVar22,auVar24);
              auVar29 = vpminsd_avx(auVar35,auVar31);
              auVar30 = vpminsd_avx(auVar36,auVar32);
              auVar29 = vpmaxsd_avx(auVar29,auVar30);
              auVar30 = vpminsd_avx(auVar37,auVar33);
              auVar29 = vpmaxsd_avx(auVar29,auVar30);
              auVar30 = vpmaxsd_avx(auVar35,auVar31);
              auVar31 = vpmaxsd_avx(auVar36,auVar32);
              auVar32 = vpminsd_avx(auVar30,auVar31);
              auVar30 = vpmaxsd_avx(auVar37,auVar33);
              auVar31 = vpmaxsd_avx(auVar29,(undefined1  [16])aVar28);
              auVar30 = vpminsd_avx(auVar30,auVar25);
              auVar30 = vpminsd_avx(auVar32,auVar30);
              uVar6 = vcmpps_avx512vl(auVar31,auVar30,2);
              bVar20 = (byte)uVar6;
              if ((uVar16 & 7) == 6) {
                uVar2 = *(undefined4 *)(uVar10 + 0x200 + lVar12);
                auVar8._4_4_ = uVar2;
                auVar8._0_4_ = uVar2;
                auVar8._8_4_ = uVar2;
                auVar8._12_4_ = uVar2;
                uVar6 = vcmpps_avx512vl(auVar41,auVar8,1);
                uVar2 = *(undefined4 *)(uVar10 + 0x1e0 + lVar12);
                auVar9._4_4_ = uVar2;
                auVar9._0_4_ = uVar2;
                auVar9._8_4_ = uVar2;
                auVar9._12_4_ = uVar2;
                uVar7 = vcmpps_avx512vl(auVar41,auVar9,0xd);
                bVar20 = (byte)uVar6 & (byte)uVar7 & bVar20;
              }
              bVar20 = bVar20 & valid_leaf.v;
              if (bVar20 != 0) {
                auVar29 = vblendmps_avx512vl(auVar49._0_16_,auVar29);
                aVar38._0_4_ = (uint)(bVar20 & 1) * auVar29._0_4_ |
                               (uint)!(bool)(bVar20 & 1) * auVar41._0_4_;
                bVar19 = (bool)(bVar20 >> 1 & 1);
                aVar38._4_4_ = (uint)bVar19 * auVar29._4_4_ | (uint)!bVar19 * auVar41._4_4_;
                bVar19 = (bool)(bVar20 >> 2 & 1);
                aVar38._8_4_ = (uint)bVar19 * auVar29._8_4_ | (uint)!bVar19 * auVar41._8_4_;
                bVar19 = (bool)(bVar20 >> 3 & 1);
                aVar38._12_4_ = (uint)bVar19 * auVar29._12_4_ | (uint)!bVar19 * auVar41._12_4_;
                aVar39 = auVar40._0_16_;
                uVar6 = vcmpps_avx512vl((undefined1  [16])aVar38,(undefined1  [16])aVar39,1);
                sVar13 = sVar17;
                sVar15 = sVar14;
                aVar42 = aVar38;
                if (((char)uVar6 == '\0') ||
                   (sVar13 = sVar14, sVar15 = sVar17, aVar42 = aVar39, aVar39 = aVar38, sVar17 != 8)
                   ) {
                  aVar38 = aVar39;
                  uVar21 = uVar21 + 1;
                  pNVar11->ptr = sVar15;
                  pNVar11 = pNVar11 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar18->v = aVar42;
                  paVar18 = paVar18 + 1;
                  sVar14 = sVar13;
                }
                auVar40 = ZEXT1664((undefined1  [16])aVar38);
                sVar17 = sVar14;
              }
            }
            if (sVar17 == 8) goto LAB_01d86e25;
            if (1 < uVar21) {
              aVar42 = paVar18[-2];
              aVar38 = paVar18[-1];
              uVar6 = vcmpps_avx512vl((undefined1  [16])aVar42,(undefined1  [16])aVar38,1);
              aVar39 = aVar38;
              if ((char)uVar6 != '\0') {
                paVar18[-2] = aVar38;
                paVar18[-1] = aVar42;
                auVar41 = vpermilps_avx(*(undefined1 (*) [16])(pNVar11 + -2),0x4e);
                *(undefined1 (*) [16])(pNVar11 + -2) = auVar41;
                aVar39 = aVar42;
                aVar42 = aVar38;
              }
              if (uVar21 != 2) {
                aVar38 = paVar18[-3];
                uVar6 = vcmpps_avx512vl((undefined1  [16])aVar38,(undefined1  [16])aVar39,1);
                if ((char)uVar6 != '\0') {
                  paVar18[-3] = aVar39;
                  paVar18[-1] = aVar38;
                  sVar14 = pNVar11[-3].ptr;
                  pNVar11[-3].ptr = pNVar11[-1].ptr;
                  pNVar11[-1].ptr = sVar14;
                  aVar38 = aVar39;
                }
                uVar6 = vcmpps_avx512vl((undefined1  [16])aVar38,(undefined1  [16])aVar42,1);
                if ((char)uVar6 != '\0') {
                  paVar18[-3] = aVar42;
                  paVar18[-2] = aVar38;
                  auVar41 = vpermilps_avx(*(undefined1 (*) [16])(pNVar11 + -3),0x4e);
                  *(undefined1 (*) [16])(pNVar11 + -3) = auVar41;
                }
              }
            }
          }
          if (sVar17 == 0xfffffffffffffff8) {
            return;
          }
          if (valid_leaf.v != 0) {
            lVar12 = (ulong)(uVar16 & 0xf) - 8;
            prim = (Primitive_conflict4 *)(sVar17 & 0xfffffffffffffff0);
            while (bVar19 = lVar12 != 0, lVar12 = lVar12 + -1, bVar19) {
              InstanceArrayIntersectorKMB<4>::intersect(&valid_leaf,&pre,ray,context,prim);
              auVar50 = ZEXT1664(auVar25);
              auVar49 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              prim = prim + 1;
            }
            bVar19 = (bool)(valid_leaf.v >> 1 & 1);
            bVar4 = (bool)(valid_leaf.v >> 2 & 1);
            bVar5 = (bool)(valid_leaf.v >> 3 & 1);
            auVar50 = ZEXT1664(CONCAT412((uint)bVar5 * *(int *)(ray + 0x8c) |
                                         (uint)!bVar5 * auVar50._12_4_,
                                         CONCAT48((uint)bVar4 * *(int *)(ray + 0x88) |
                                                  (uint)!bVar4 * auVar50._8_4_,
                                                  CONCAT44((uint)bVar19 * *(int *)(ray + 0x84) |
                                                           (uint)!bVar19 * auVar50._4_4_,
                                                           (uint)(valid_leaf.v & 1) *
                                                           *(int *)(ray + 0x80) |
                                                           (uint)!(bool)(valid_leaf.v & 1) *
                                                           auVar50._0_4_))));
          }
        }
        goto LAB_01d86e25;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }